

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O3

string * __thiscall CLI::App::_compare_subcommand_names_abi_cxx11_(App *this,App *subcom,App *base)

{
  pointer psVar1;
  size_type sVar2;
  pointer pcVar3;
  string *psVar4;
  bool bVar5;
  string *psVar6;
  element_type *base_00;
  App *pAVar7;
  pointer psVar8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (_compare_subcommand_names[abi:cxx11](CLI::App_const&,CLI::App_const&)::estring_abi_cxx11_ ==
      '\0') {
    _compare_subcommand_names_abi_cxx11_();
  }
  if (subcom->disabled_ == false) {
    psVar8 = (base->subcommands_).
             super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (base->subcommands_).
             super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar8 != psVar1) {
      do {
        pAVar7 = (psVar8->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if ((pAVar7 != subcom) && (pAVar7->disabled_ == false)) {
          sVar2 = (subcom->name_)._M_string_length;
          if (sVar2 != 0) {
            pcVar3 = (subcom->name_)._M_dataplus._M_p;
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            ::std::__cxx11::string::_M_construct<char*>((string *)&local_70,pcVar3,pcVar3 + sVar2);
            bVar5 = check_name(pAVar7,&local_70);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            if (bVar5) {
              return &subcom->name_;
            }
            pAVar7 = (psVar8->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          }
          sVar2 = (pAVar7->name_)._M_string_length;
          if (sVar2 != 0) {
            pcVar3 = (pAVar7->name_)._M_dataplus._M_p;
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            ::std::__cxx11::string::_M_construct<char*>((string *)&local_b0,pcVar3,pcVar3 + sVar2);
            bVar5 = check_name(subcom,&local_b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
            if (bVar5) {
              return &((psVar8->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                      name_;
            }
          }
          psVar4 = (subcom->aliases_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (psVar6 = (subcom->aliases_).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar4;
              psVar6 = psVar6 + 1) {
            pAVar7 = (psVar8->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            pcVar3 = (psVar6->_M_dataplus)._M_p;
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_90,pcVar3,pcVar3 + psVar6->_M_string_length);
            bVar5 = check_name(pAVar7,&local_90);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
            }
            if (bVar5) {
              return psVar6;
            }
          }
          base_00 = (psVar8->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          psVar6 = (base_00->aliases_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          psVar4 = (base_00->aliases_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (psVar6 != psVar4) {
            do {
              pcVar3 = (psVar6->_M_dataplus)._M_p;
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_50,pcVar3,pcVar3 + psVar6->_M_string_length);
              bVar5 = check_name(subcom,&local_50);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
              if (bVar5) {
                return psVar6;
              }
              psVar6 = psVar6 + 1;
            } while (psVar6 != psVar4);
            base_00 = (psVar8->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          }
          if (((base_00->name_)._M_string_length == 0) &&
             (psVar6 = _compare_subcommand_names_abi_cxx11_(this,subcom,base_00),
             psVar6->_M_string_length != 0)) {
            return psVar6;
          }
          if (((subcom->name_)._M_string_length == 0) &&
             (psVar6 = _compare_subcommand_names_abi_cxx11_
                                 (this,(psVar8->
                                       super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>).
                                       _M_ptr,subcom), psVar6->_M_string_length != 0)) {
            return psVar6;
          }
        }
        psVar8 = psVar8 + 1;
      } while (psVar8 != psVar1);
    }
  }
  return &_compare_subcommand_names[abi:cxx11](CLI::App_const&,CLI::App_const&)::estring_abi_cxx11_;
}

Assistant:

const std::string &_compare_subcommand_names(const App &subcom, const App &base) const {
        static const std::string estring;
        if(subcom.disabled_) {
            return estring;
        }
        for(auto &subc : base.subcommands_) {
            if(subc.get() != &subcom) {
                if(subc->disabled_) {
                    continue;
                }
                if(!subcom.get_name().empty()) {
                    if(subc->check_name(subcom.get_name())) {
                        return subcom.get_name();
                    }
                }
                if(!subc->get_name().empty()) {
                    if(subcom.check_name(subc->get_name())) {
                        return subc->get_name();
                    }
                }
                for(const auto &les : subcom.aliases_) {
                    if(subc->check_name(les)) {
                        return les;
                    }
                }
                // this loop is needed in case of ignore_underscore or ignore_case on one but not the other
                for(const auto &les : subc->aliases_) {
                    if(subcom.check_name(les)) {
                        return les;
                    }
                }
                // if the subcommand is an option group we need to check deeper
                if(subc->get_name().empty()) {
                    auto &cmpres = _compare_subcommand_names(subcom, *subc);
                    if(!cmpres.empty()) {
                        return cmpres;
                    }
                }
                // if the test subcommand is an option group we need to check deeper
                if(subcom.get_name().empty()) {
                    auto &cmpres = _compare_subcommand_names(*subc, subcom);
                    if(!cmpres.empty()) {
                        return cmpres;
                    }
                }
            }
        }
        return estring;
    }